

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlXPathObjectPtr xmlXPathNewNodeSetList(xmlNodeSetPtr val)

{
  int iVar1;
  xmlXPathObjectPtr pxVar2;
  long lVar3;
  
  if (val != (xmlNodeSetPtr)0x0) {
    if (val->nodeTab == (xmlNodePtr *)0x0) {
      pxVar2 = xmlXPathNewNodeSet((xmlNodePtr)0x0);
      return pxVar2;
    }
    pxVar2 = xmlXPathNewNodeSet(*val->nodeTab);
    if (pxVar2 != (xmlXPathObjectPtr)0x0) {
      if (val->nodeNr < 2) {
        return pxVar2;
      }
      lVar3 = 1;
      do {
        iVar1 = xmlXPathNodeSetAddUnique(pxVar2->nodesetval,val->nodeTab[lVar3]);
        if (iVar1 < 0) {
          return pxVar2;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < val->nodeNr);
      return pxVar2;
    }
  }
  return (xmlXPathObjectPtr)0x0;
}

Assistant:

xmlXPathObjectPtr
xmlXPathNewNodeSetList(xmlNodeSetPtr val)
{
    xmlXPathObjectPtr ret;
    int i;

    if (val == NULL)
        ret = NULL;
    else if (val->nodeTab == NULL)
        ret = xmlXPathNewNodeSet(NULL);
    else {
        ret = xmlXPathNewNodeSet(val->nodeTab[0]);
        if (ret) {
            for (i = 1; i < val->nodeNr; ++i) {
                /* TODO: Propagate memory error. */
                if (xmlXPathNodeSetAddUnique(ret->nodesetval, val->nodeTab[i])
		    < 0) break;
	    }
	}
    }

    return (ret);
}